

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fAttribLocationTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles3::Functional::createAttributeLocationTests(Context *context)

{
  AttribType *type_12;
  deUint32 dVar1;
  TestCaseGroup *this;
  TestCaseGroup *pTVar2;
  BindAttributeTest *this_00;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  BindMaxAttributesTest *this_01;
  BindAliasingAttributeTest *pBVar5;
  BindMaxAliasingAttributeTest *this_02;
  BindInactiveAliasingAttributeTest *this_03;
  BindHoleAttributeTest *this_04;
  PreAttachBindAttributeTest *this_05;
  PreLinkBindAttributeTest *this_06;
  PostLinkBindAttributeTest *this_07;
  BindRelinkAttributeTest *this_08;
  BindReattachAttributeTest *this_09;
  LocationAttributeTest *this_10;
  LocationMaxAttributesTest *this_11;
  LocationHoleAttributeTest *this_12;
  MixedAttributeTest *this_13;
  MixedMaxAttributesTest *this_14;
  PreAttachMixedAttributeTest *this_15;
  PreLinkMixedAttributeTest *this_16;
  PostLinkMixedAttributeTest *this_17;
  MixedRelinkAttributeTest *this_18;
  MixedReattachAttributeTest *this_19;
  MixedHoleAttributeTest *this_20;
  BindRelinkHoleAttributeTest *this_21;
  MixedRelinkHoleAttributeTest *this_22;
  AttribType *local_10e0;
  AttribType *local_10c8;
  AttribType *type_11;
  int typeNdx_11;
  TestCaseGroup *relinkMixedHoleGroup;
  AttribType *type_10;
  int typeNdx_10;
  TestCaseGroup *relinkBindHoleGroup;
  AttribType *type_9;
  int typeNdx_9;
  TestCaseGroup *holeGroup_2;
  TestCaseGroup *mixedTimeGroup;
  AttribType *type_8;
  int typeNdx_8;
  TestCaseGroup *mixedMaxAttributeGroup;
  AttribType *type_7;
  int typeNdx_7;
  TestCaseGroup *mixedAttributeGroup;
  AttribType *type_6;
  int typeNdx_6;
  TestCaseGroup *holeGroup_1;
  AttribType *type_5;
  int typeNdx_5;
  TestCaseGroup *layoutMaxAttributeGroup;
  AttribType *type_4;
  int typeNdx_4;
  TestCaseGroup *layoutAttributeGroup;
  TestCaseGroup *bindTimeGroup;
  AttribType *type_3;
  int typeNdx_3;
  TestCaseGroup *holeGroup;
  AttribType *type_2;
  int typeNdx_2;
  TestCaseGroup *aliasingGroup;
  AttribType *type_1;
  int typeNdx_1;
  TestCaseGroup *bindMaxAttributeGroup;
  AttribType *type;
  int typeNdx;
  TestCaseGroup *bindAttributeGroup;
  TestCaseGroup *root;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  AttribType *local_8d0;
  AttribType local_8c8 [4];
  AttribType local_828;
  AttribType local_800;
  AttribType local_7d8;
  undefined1 auStack_7b0 [8];
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_401;
  string local_400;
  AttribType *local_3e0;
  AttribType local_3d8 [4];
  AttribType local_338;
  AttribType local_310;
  AttribType local_2e8;
  AttribType local_2c0;
  AttribType local_298;
  AttribType local_270;
  AttribType local_248;
  AttribType local_220;
  AttribType local_1f8;
  AttribType local_1d0;
  AttribType local_1a8;
  AttribType local_180;
  AttribType local_158;
  AttribType local_130;
  AttribType local_108;
  AttribType local_e0;
  AttribType local_b8;
  AttribType local_90;
  AttribType local_68;
  AttribType local_40;
  Context *local_18;
  Context *context_local;
  
  auStack_7b0[6] = 1;
  local_3e0 = local_3d8;
  local_18 = context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"float",&local_401);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3d8,&local_400,1,0x1406);
  local_3e0 = local_3d8 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"vec2",&local_439);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3d8 + 1,&local_438,1,0x8b50);
  local_3e0 = local_3d8 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"vec3",&local_461);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3d8 + 2,&local_460,1,0x8b51);
  local_3e0 = local_3d8 + 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"vec4",&local_489);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3d8 + 3,&local_488,1,0x8b52);
  local_3e0 = &local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"mat2",&local_4b1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_338,&local_4b0,2,0x8b5a);
  local_3e0 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"mat3",&local_4d9);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_310,&local_4d8,3,0x8b5b);
  local_3e0 = &local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"mat4",&local_501);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_2e8,&local_500,4,0x8b5c);
  local_3e0 = &local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"int",&local_529);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_2c0,&local_528,1,0x1404);
  local_3e0 = &local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"ivec2",&local_551);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_298,&local_550,1,0x8b53);
  local_3e0 = &local_270;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"ivec3",&local_579);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_270,&local_578,1,0x8b54);
  local_3e0 = &local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"ivec4",&local_5a1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_248,&local_5a0,1,0x8b55);
  local_3e0 = &local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"uint",&local_5c9);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_220,&local_5c8,1,0x1405);
  local_3e0 = &local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"uvec2",&local_5f1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1f8,&local_5f0,1,0x8dc6);
  local_3e0 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"uvec3",&local_619);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1d0,&local_618,1,0x8dc7);
  local_3e0 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"uvec4",&local_641);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1a8,&local_640,1,0x8dc8);
  local_3e0 = &local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"mat2x2",&local_669);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_180,&local_668,2,0x8b5a);
  local_3e0 = &local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"mat2x3",&local_691);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_158,&local_690,2,0x8b65);
  local_3e0 = &local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"mat2x4",&local_6b9);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_130,&local_6b8,2,0x8b66);
  local_3e0 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"mat3x2",&local_6e1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_108,&local_6e0,3,0x8b67);
  local_3e0 = &local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"mat3x3",&local_709);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_e0,&local_708,3,0x8b5b);
  local_3e0 = &local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"mat3x4",&local_731);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_b8,&local_730,3,0x8b68);
  local_3e0 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"mat4x2",&local_759);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_90,&local_758,4,0x8b69);
  local_3e0 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"mat4x3",&local_781);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_68,&local_780,4,0x8b6a);
  local_3e0 = &local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"mat4x4",(allocator<char> *)(auStack_7b0 + 7));
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_40,&local_7a8,4,0x8b5c);
  auStack_7b0[6] = 0;
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)(auStack_7b0 + 7));
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  root._6_1_ = 1;
  local_8d0 = local_8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"float",&local_8f1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_8c8,&local_8f0,1,0x1406);
  local_8d0 = local_8c8 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"vec2",&local_919);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_8c8 + 1,&local_918,1,0x8b50);
  local_8d0 = local_8c8 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"vec3",&local_941);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_8c8 + 2,&local_940,1,0x8b51);
  local_8d0 = local_8c8 + 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"vec4",&local_969);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_8c8 + 3,&local_968,1,0x8b52);
  local_8d0 = &local_828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"mat2",&local_991);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_828,&local_990,2,0x8b5a);
  local_8d0 = &local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"mat3",&local_9b9);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_800,&local_9b8,3,0x8b5b);
  local_8d0 = &local_7d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"mat4",(allocator<char> *)((long)&root + 7));
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_7d8,&local_9e0,4,0x8b5c);
  root._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&root + 7));
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,local_18,"attribute_location","Attribute location tests");
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,local_18,"bind","Basic bind attribute location tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type._4_4_ = 0; type._4_4_ < 0x18; type._4_4_ = type._4_4_ + 1) {
    this_00 = (BindAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindAttributeTest::BindAttributeTest(this_00,pTVar3,pRVar4,local_3d8 + type._4_4_,-1)
    ;
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_00);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"bind_max_attributes","Use bind with maximum number of attributes.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_1._4_4_ = 0; type_1._4_4_ < 0x18; type_1._4_4_ = type_1._4_4_ + 1) {
    this_01 = (BindMaxAttributesTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindMaxAttributesTest::BindMaxAttributesTest
              (this_01,pTVar3,pRVar4,local_3d8 + type_1._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_01);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,local_18,"bind_aliasing","Test binding aliasing locations.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_2._4_4_ = 0; type_2._4_4_ < 7; type_2._4_4_ = type_2._4_4_ + 1) {
    type_12 = local_8c8 + type_2._4_4_;
    pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
              (pBVar5,pTVar3,pRVar4,type_12,0,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pBVar5);
    dVar1 = deqp::gls::AttributeLocationTestUtil::AttribType::getLocationSize(type_12);
    if (1 < dVar1) {
      pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
      pTVar3 = gles3::Context::getTestContext(local_18);
      pRVar4 = gles3::Context::getRenderContext(local_18);
      deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
                (pBVar5,pTVar3,pRVar4,type_12,1,-1);
      tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pBVar5);
    }
    this_02 = (BindMaxAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest
              (this_02,pTVar3,pRVar4,type_12,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_02);
    this_03 = (BindInactiveAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest
              (this_03,pTVar3,pRVar4,type_12,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_03);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"bind_hole",
             "Bind all, but one attribute and leave hole in location space for it.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_3._4_4_ = 0; type_3._4_4_ < 0x18; type_3._4_4_ = type_3._4_4_ + 1) {
    this_04 = (BindHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindHoleAttributeTest::BindHoleAttributeTest
              (this_04,pTVar3,pRVar4,local_3d8 + type_3._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_04);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"bind_time","Bind time tests. Test binding at different stages.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  this_05 = (PreAttachBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PreAttachBindAttributeTest::PreAttachBindAttributeTest(this_05,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_05);
  this_06 = (PreLinkBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PreLinkBindAttributeTest::PreLinkBindAttributeTest(this_06,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_06);
  this_07 = (PostLinkBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PostLinkBindAttributeTest::PostLinkBindAttributeTest(this_07,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_07);
  this_08 = (BindRelinkAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::BindRelinkAttributeTest::BindRelinkAttributeTest(this_08,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_08);
  this_09 = (BindReattachAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::BindReattachAttributeTest::BindReattachAttributeTest(this_09,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_09);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,local_18,"layout","Basic layout location tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_4._4_4_ = 0; type_4._4_4_ < 0x18; type_4._4_4_ = type_4._4_4_ + 1) {
    this_10 = (LocationAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::LocationAttributeTest::LocationAttributeTest
              (this_10,pTVar3,pRVar4,local_3d8 + type_4._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_10);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"layout_max_attributes",
             "Maximum attributes used with layout location qualifiers.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_5._4_4_ = 0; type_5._4_4_ < 0x18; type_5._4_4_ = type_5._4_4_ + 1) {
    this_11 = (LocationMaxAttributesTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::LocationMaxAttributesTest::LocationMaxAttributesTest
              (this_11,pTVar3,pRVar4,local_3d8 + type_5._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_11);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"layout_hole",
             "Define layout location for all, but one attribute consuming max attribute locations.")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_6._4_4_ = 0; type_6._4_4_ < 0x18; type_6._4_4_ = type_6._4_4_ + 1) {
    this_12 = (LocationHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::LocationHoleAttributeTest::LocationHoleAttributeTest
              (this_12,pTVar3,pRVar4,local_3d8 + type_6._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_12);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,local_18,"mixed","Basic mixed location tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_7._4_4_ = 0; type_7._4_4_ < 0x18; type_7._4_4_ = type_7._4_4_ + 1) {
    this_13 = (MixedAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::MixedAttributeTest::MixedAttributeTest
              (this_13,pTVar3,pRVar4,local_3d8 + type_7._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_13);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"mixed_max_attributes",
             "Maximum attributes used with mixed binding and layout qualifiers.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_8._4_4_ = 0; type_8._4_4_ < 0x18; type_8._4_4_ = type_8._4_4_ + 1) {
    this_14 = (MixedMaxAttributesTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::MixedMaxAttributesTest::MixedMaxAttributesTest
              (this_14,pTVar3,pRVar4,local_3d8 + type_8._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_14);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"mixed_time","Bind time tests. Test binding at different stages.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  this_15 = (PreAttachMixedAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PreAttachMixedAttributeTest::PreAttachMixedAttributeTest(this_15,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_15);
  this_16 = (PreLinkMixedAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PreLinkMixedAttributeTest::PreLinkMixedAttributeTest(this_16,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_16);
  this_17 = (PostLinkMixedAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::PostLinkMixedAttributeTest::PostLinkMixedAttributeTest(this_17,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_17);
  this_18 = (MixedRelinkAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::MixedRelinkAttributeTest::MixedRelinkAttributeTest(this_18,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_18);
  this_19 = (MixedReattachAttributeTest *)operator_new(0x78);
  pTVar3 = gles3::Context::getTestContext(local_18);
  pRVar4 = gles3::Context::getRenderContext(local_18);
  deqp::gls::MixedReattachAttributeTest::MixedReattachAttributeTest(this_19,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_19);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"mixed_hole",
             "Use layout location qualifiers and binding. Leave hole in location space for only free attribute."
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_9._4_4_ = 0; type_9._4_4_ < 0x18; type_9._4_4_ = type_9._4_4_ + 1) {
    this_20 = (MixedHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::MixedHoleAttributeTest::MixedHoleAttributeTest
              (this_20,pTVar3,pRVar4,local_3d8 + type_9._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_20);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"bind_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_10._4_4_ = 0; type_10._4_4_ < 0x18; type_10._4_4_ = type_10._4_4_ + 1) {
    this_21 = (BindRelinkHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::BindRelinkHoleAttributeTest::BindRelinkHoleAttributeTest
              (this_21,pTVar3,pRVar4,local_3d8 + type_10._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_21);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,local_18,"mixed_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_11._4_4_ = 0; type_11._4_4_ < 0x18; type_11._4_4_ = type_11._4_4_ + 1) {
    this_22 = (MixedRelinkHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles3::Context::getTestContext(local_18);
    pRVar4 = gles3::Context::getRenderContext(local_18);
    deqp::gls::MixedRelinkHoleAttributeTest::MixedRelinkHoleAttributeTest
              (this_22,pTVar3,pRVar4,local_3d8 + type_11._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_22);
  }
  local_10c8 = (AttribType *)auStack_7b0;
  context_local = (Context *)this;
  do {
    local_10c8 = local_10c8 + -1;
    deqp::gls::AttributeLocationTestUtil::AttribType::~AttribType(local_10c8);
  } while (local_10c8 != local_8c8);
  local_10e0 = (AttribType *)&local_18;
  do {
    local_10e0 = local_10e0 + -1;
    deqp::gls::AttributeLocationTestUtil::AttribType::~AttribType(local_10e0);
  } while (local_10e0 != local_3d8);
  return (TestCaseGroup *)context_local;
}

Assistant:

TestCaseGroup* createAttributeLocationTests	(Context& context)
{
	const AttribType	types[] =
	{
		AttribType("float",		1,  GL_FLOAT),
		AttribType("vec2",		1,  GL_FLOAT_VEC2),
		AttribType("vec3",		1,  GL_FLOAT_VEC3),
		AttribType("vec4",		1,  GL_FLOAT_VEC4),

		AttribType("mat2",		2,  GL_FLOAT_MAT2),
		AttribType("mat3",		3,  GL_FLOAT_MAT3),
		AttribType("mat4",		4,  GL_FLOAT_MAT4),

		AttribType("int",		1,	GL_INT),
		AttribType("ivec2",		1,	GL_INT_VEC2),
		AttribType("ivec3",		1,	GL_INT_VEC3),
		AttribType("ivec4",		1,	GL_INT_VEC4),

		AttribType("uint",		1,	GL_UNSIGNED_INT),
		AttribType("uvec2",		1,	GL_UNSIGNED_INT_VEC2),
		AttribType("uvec3",		1,	GL_UNSIGNED_INT_VEC3),
		AttribType("uvec4",		1,	GL_UNSIGNED_INT_VEC4),

		AttribType("mat2x2",	2,	GL_FLOAT_MAT2),
		AttribType("mat2x3",	2,	GL_FLOAT_MAT2x3),
		AttribType("mat2x4",	2,	GL_FLOAT_MAT2x4),

		AttribType("mat3x2",	3,	GL_FLOAT_MAT3x2),
		AttribType("mat3x3",	3,	GL_FLOAT_MAT3),
		AttribType("mat3x4",	3,	GL_FLOAT_MAT3x4),

		AttribType("mat4x2",	4,	GL_FLOAT_MAT4x2),
		AttribType("mat4x3",	4,	GL_FLOAT_MAT4x3),
		AttribType("mat4x4",	4,	GL_FLOAT_MAT4)
	};

	const AttribType	es2Types[] =
	{
		AttribType("float",	1,  GL_FLOAT),
		AttribType("vec2",	1,  GL_FLOAT_VEC2),
		AttribType("vec3",	1,  GL_FLOAT_VEC3),
		AttribType("vec4",	1,  GL_FLOAT_VEC4),

		AttribType("mat2",	2,  GL_FLOAT_MAT2),
		AttribType("mat3",	3,  GL_FLOAT_MAT3),
		AttribType("mat4",	4,  GL_FLOAT_MAT4)
	};

	TestCaseGroup* const root = new TestCaseGroup (context, "attribute_location", "Attribute location tests");

	// Basic bind attribute tests
	{
		TestCaseGroup* const bindAttributeGroup = new TestCaseGroup(context, "bind", "Basic bind attribute location tests.");

		root->addChild(bindAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindAttributeGroup->addChild(new gls::BindAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Bind max number of attributes
	{
		TestCaseGroup* const bindMaxAttributeGroup = new TestCaseGroup(context, "bind_max_attributes", "Use bind with maximum number of attributes.");

		root->addChild(bindMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindMaxAttributeGroup->addChild(new gls::BindMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test aliasing
	{
		TestCaseGroup* const aliasingGroup = new TestCaseGroup(context, "bind_aliasing", "Test binding aliasing locations.");

		root->addChild(aliasingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(es2Types); typeNdx++)
		{
			const AttribType& type = es2Types[typeNdx];

			// Simple aliasing cases
			aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// For types which occupy more than one location. Alias second location.
			if (type.getLocationSize() > 1)
				aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type, 1));

			// Use more than maximum attributes with aliasing
			aliasingGroup->addChild(new gls::BindMaxAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// Use more than maximum attributes but inactive
			aliasingGroup->addChild(new gls::BindInactiveAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "bind_hole", "Bind all, but one attribute and leave hole in location space for it.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Bind first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::BindHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test binding at different times
	{
		TestCaseGroup* const bindTimeGroup = new TestCaseGroup(context, "bind_time", "Bind time tests. Test binding at different stages.");

		root->addChild(bindTimeGroup);

		bindTimeGroup->addChild(new gls::PreAttachBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PreLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PostLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	// Basic layout location attribute tests
	{
		TestCaseGroup* const layoutAttributeGroup = new TestCaseGroup(context, "layout", "Basic layout location tests.");

		root->addChild(layoutAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			layoutAttributeGroup->addChild(new gls::LocationAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test max attributes with layout locations
	{
		TestCaseGroup* const layoutMaxAttributeGroup = new TestCaseGroup(context, "layout_max_attributes", "Maximum attributes used with layout location qualifiers.");

		root->addChild(layoutMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			layoutMaxAttributeGroup->addChild(new gls::LocationMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "layout_hole", "Define layout location for all, but one attribute consuming max attribute locations.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Location first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::LocationHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Basic mixed mixed attribute tests
	{
		TestCaseGroup* const mixedAttributeGroup = new TestCaseGroup(context, "mixed", "Basic mixed location tests.");

		root->addChild(mixedAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			mixedAttributeGroup->addChild(new gls::MixedAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	{
		TestCaseGroup* const mixedMaxAttributeGroup = new TestCaseGroup(context, "mixed_max_attributes", "Maximum attributes used with mixed binding and layout qualifiers.");

		root->addChild(mixedMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			mixedMaxAttributeGroup->addChild(new gls::MixedMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test mixed binding at different times
	{
		TestCaseGroup* const mixedTimeGroup = new TestCaseGroup(context, "mixed_time", "Bind time tests. Test binding at different stages.");

		root->addChild(mixedTimeGroup);

		mixedTimeGroup->addChild(new gls::PreAttachMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::PreLinkMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::PostLinkMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::MixedRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::MixedReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "mixed_hole", "Use layout location qualifiers and binding. Leave hole in location space for only free attribute.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			holeGroup->addChild(new gls::MixedHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test hole in location space that moves when relinking
	{
		TestCaseGroup* const relinkBindHoleGroup = new TestCaseGroup(context, "bind_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkBindHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkBindHoleGroup->addChild(new gls::BindRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test hole in location space that moves when relinking
	{
		TestCaseGroup* const relinkMixedHoleGroup = new TestCaseGroup(context, "mixed_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkMixedHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkMixedHoleGroup->addChild(new gls::MixedRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	return root;
}